

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Queries::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  Context *context_local;
  FunctionalTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"queries_functional","Queries Functional Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest_0324f598;
  this->m_pGetQueryBufferObjectiv = (PFNGLGETQUERYBUFFEROBJECT)0x0;
  this->m_pGetQueryBufferObjectuiv = (PFNGLGETQUERYBUFFEROBJECT)0x0;
  this->m_pGetQueryBufferObjecti64v = (PFNGLGETQUERYBUFFEROBJECT)0x0;
  this->m_pGetQueryBufferObjectui64v = (PFNGLGETQUERYBUFFEROBJECT)0x0;
  this->m_fbo = 0;
  this->m_rbo = 0;
  this->m_vao = 0;
  this->m_bo_query = 0;
  this->m_bo_xfb = 0;
  this->m_qo = (GLuint *)0x0;
  this->m_po = 0;
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "queries_functional", "Queries Functional Test")
	, m_pGetQueryBufferObjectiv(DE_NULL)
	, m_pGetQueryBufferObjectuiv(DE_NULL)
	, m_pGetQueryBufferObjecti64v(DE_NULL)
	, m_pGetQueryBufferObjectui64v(DE_NULL)
	, m_fbo(0)
	, m_rbo(0)
	, m_vao(0)
	, m_bo_query(0)
	, m_bo_xfb(0)
	, m_qo(DE_NULL)
	, m_po(0)
{
	/* Intentionally left blank. */
}